

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::if2ip(string *__return_storage_ptr__,string *ifn)

{
  bool bVar1;
  char *pcVar2;
  allocator local_49;
  char local_48 [8];
  char buf [16];
  sockaddr_in *sa;
  ifaddrs *ifa;
  ifaddrs *ifap;
  string *ifn_local;
  
  ifap = (ifaddrs *)ifn;
  ifn_local = __return_storage_ptr__;
  getifaddrs(&ifa);
  sa = (sockaddr_in *)ifa;
  while( true ) {
    if (sa == (sockaddr_in *)0x0) {
      freeifaddrs(ifa);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if ((((*(long *)sa[1].sin_zero != 0) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)ifap,*(char **)sa->sin_zero), bVar1)) &&
        (**(short **)sa[1].sin_zero == 2)) &&
       (pcVar2 = inet_ntop(2,(void *)(*(long *)sa[1].sin_zero + 4),local_48,0x10),
       pcVar2 != (char *)0x0)) break;
    sa = *(sockaddr_in **)sa;
  }
  freeifaddrs(ifa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_48,0x10,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return __return_storage_ptr__;
}

Assistant:

inline std::string if2ip(const std::string &ifn) {
			struct ifaddrs *ifap;
			getifaddrs(&ifap);
			for (auto ifa = ifap; ifa; ifa = ifa->ifa_next) {
				if (ifa->ifa_addr && ifn == ifa->ifa_name) {
					if (ifa->ifa_addr->sa_family == AF_INET) {
						auto sa = reinterpret_cast<struct sockaddr_in *>(ifa->ifa_addr);
						char buf[INET_ADDRSTRLEN];
						if (inet_ntop(AF_INET, &sa->sin_addr, buf, INET_ADDRSTRLEN)) {
							freeifaddrs(ifap);
							return std::string(buf, INET_ADDRSTRLEN);
						}
					}
				}
			}
			freeifaddrs(ifap);
			return std::string();
		}